

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O1

size_t portability_path_canonical(char *path,size_t path_size,char *canonical,size_t canonical_size)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  ulong uVar5;
  char cVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  
  if (canonical == (char *)0x0 || path == (char *)0x0) {
    return 0;
  }
  bVar8 = path_size != 0;
  if (path_size == 0) {
    cVar7 = '/';
  }
  else {
    cVar7 = *path;
    if (cVar7 != '/') {
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        if (path_size == uVar5) break;
        uVar2 = uVar5 + 1;
      } while (path[uVar5] != '/');
      cVar7 = '/';
      bVar8 = uVar5 < path_size;
    }
  }
  cVar6 = *path;
  if (canonical_size == 0 || cVar6 != '.') {
    uVar2 = 0;
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    uVar2 = 0;
    do {
      if (path[uVar5 + 1] == '/') {
        uVar5 = uVar5 + 1;
LAB_0011621e:
        uVar2 = 0;
      }
      else {
        if ((path[uVar5 + 1] == '.') && (path[uVar5 + 2] == '/')) {
          uVar5 = uVar5 + 2;
          goto LAB_0011621e;
        }
        canonical[uVar2] = cVar6;
        uVar2 = uVar2 + 1;
      }
      lVar1 = uVar5 + 1;
      uVar5 = uVar5 + 1;
    } while ((path[lVar1] == '.') && (cVar6 = '.', uVar2 < canonical_size));
  }
  if (uVar2 < canonical_size && uVar5 < path_size) {
    do {
      if (path[uVar5] == '.') {
        uVar3 = uVar5 + 1;
        cVar6 = path[uVar5 + 1];
        if (cVar6 == '\0') {
          uVar2 = (uVar2 - 1) + (ulong)(uVar2 < 2);
          uVar5 = uVar3;
        }
        else if (cVar6 == '/') {
          if (path[uVar5 + 2] == '.') {
            bVar9 = uVar2 == 0;
            uVar2 = uVar2 - 1;
            uVar5 = uVar3;
            if (bVar9) {
              uVar2 = 0;
            }
          }
          else {
LAB_001162a6:
            uVar5 = uVar5 + 2;
          }
        }
        else if (cVar6 == '.') {
          if (2 < uVar2) {
            uVar2 = uVar2 - 2;
            if (uVar2 != 0) {
              do {
                if (canonical[uVar2] == '/') goto LAB_001162a6;
                uVar2 = uVar2 - 1;
              } while (uVar2 != 0);
              uVar2 = 0;
            }
            goto LAB_001162a6;
          }
          uVar3 = uVar5 + 3;
          if (path[uVar5 + 3] == '.') {
            uVar3 = uVar5 + 2;
          }
          uVar2 = 0;
          uVar5 = uVar3;
        }
      }
      cVar6 = path[uVar5];
      cVar4 = cVar6;
      if (cVar6 == '/') {
        cVar4 = cVar7;
      }
      if (!bVar8) {
        cVar4 = cVar6;
      }
      canonical[uVar2] = cVar4;
      uVar2 = uVar2 + 1;
      uVar5 = uVar5 + 1;
    } while ((uVar5 < path_size) && (uVar2 < canonical_size));
  }
  return uVar2;
}

Assistant:

size_t portability_path_canonical(const char *path, size_t path_size, char *canonical, size_t canonical_size)
{
	if (path == NULL || canonical == NULL)
	{
		return 0;
	}

	size_t iterator, size = 0;
	int separator_found = 1;
	char separator = PORTABILITY_PATH_SEPARATOR_C; /* Use current platform style as default */

	/* Standarize the separators */
	for (iterator = 0; iterator < path_size; ++iterator)
	{
		if (PORTABILITY_PATH_SEPARATOR(path[iterator]))
		{
			separator_found = 0;
			separator = path[iterator];
			break;
		}
	}

	/* Remove first dots */
	for (iterator = 0; path[iterator] == '.' && size < canonical_size; ++iterator)
	{
		size_t next_first = iterator + 1;
		size_t next_second = iterator + 2;

		if (PORTABILITY_PATH_SEPARATOR(path[next_first]))
		{
			++iterator;
			size = 0;
		}
		else if (path[next_first] == '.' && PORTABILITY_PATH_SEPARATOR(path[next_second]))
		{
			iterator += 2;
			size = 0;
		}
		else
		{
			canonical[size++] = path[iterator];
		}
	}

	/* Canonicalize the path */
	for (/* void */; iterator < path_size && size < canonical_size; ++iterator)
	{
		if (path[iterator] == '.')
		{
			size_t next = iterator + 1;

			if (path[next] == '.')
			{
				if (size > 2)
				{
					size -= 2;

					while (size > 0 && !PORTABILITY_PATH_SEPARATOR(canonical[size]))
					{
						--size;
					}

					iterator += 2;
				}
				else
				{
					size = 0;

					if (path[iterator + 3] == '.')
					{
						iterator += 2;
					}
					else
					{
						iterator += 3;
					}
				}
			}
			else if (PORTABILITY_PATH_SEPARATOR(path[next]))
			{
				if (path[next + 1] == '.')
				{
					iterator += 1;

					if (size > 0)
					{
						--size;
					}
				}
				else
				{
					iterator += 2;
				}
			}
			else if (path[next] == '\0')
			{
				if (size > 1)
				{
					--size;
				}

				++iterator;
			}
		}

		/* Store the correct separator */
		canonical[size++] = PORTABILITY_PATH_SEPARATOR(path[iterator]) && separator_found == 0 ? separator : path[iterator];
	}

	return size;
}